

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

int PHF::init<phf_string,true>(phf *phf,phf_string *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  void *__base;
  void *__ptr;
  uint32_t *puVar4;
  int *piVar5;
  ulong uVar6;
  size_t sVar7;
  size_t __nmemb;
  uint *puVar8;
  uint uVar9;
  ulong __nmemb_00;
  void *local_58;
  
  __nmemb_00 = n + (n == 0);
  uVar6 = l + (l == 0);
  sVar7 = 100;
  if (a < 100) {
    sVar7 = a;
  }
  phf->nodiv = true;
  if (__nmemb_00 <= uVar6) {
    uVar6 = __nmemb_00;
  }
  uVar6 = __nmemb_00 / uVar6 - 1;
  uVar6 = uVar6 >> 1 | uVar6;
  uVar6 = uVar6 >> 2 | uVar6;
  uVar6 = uVar6 >> 4 | uVar6;
  uVar6 = uVar6 >> 8 | uVar6;
  uVar6 = uVar6 >> 0x10 | uVar6;
  uVar3 = (__nmemb_00 * 100) / (sVar7 + (sVar7 == 0)) - 1;
  uVar3 = uVar3 >> 1 | uVar3;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar3 = uVar3 >> 0x10 | uVar3;
  uVar3 = uVar3 >> 0x20 | uVar3;
  sVar7 = uVar3 + 1;
  __nmemb = (uVar6 >> 0x20 | uVar6) + 1;
  if (__nmemb == 0) {
    return 0x22;
  }
  if (sVar7 == 0) {
    return 0x22;
  }
  __base = calloc(__nmemb_00,0x20);
  if ((__base == (void *)0x0) || (local_58 = calloc(__nmemb,8), local_58 == (void *)0x0)) {
    __ptr = (void *)0x0;
    local_58 = (void *)0x0;
  }
  else {
    if (n != 0) {
      puVar8 = (uint *)k->p;
      for (uVar6 = k->n; 3 < uVar6; uVar6 = uVar6 - 4) {
        uVar9 = *puVar8;
        uVar1 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8;
        uVar9 = ((uVar1 | uVar9 << 0x18) * -0x3361d2af >> 0x11 | uVar1 * 0x16a88000) * 0x1b873593 ^
                seed;
        seed = (uVar9 << 0xd | uVar9 >> 0x13) * 5 + 0xe6546b64;
        puVar8 = puVar8 + 1;
      }
      iVar2 = (*(code *)(&DAT_0013b9e0 + *(int *)(&DAT_0013b9e0 + uVar6 * 4)))(seed);
      return iVar2;
    }
    qsort(__base,__nmemb_00,0x20,phf_keycmp<phf_string>);
    __ptr = calloc((uVar3 + 0x40 >> 6) * 2,8);
    if (__ptr == (void *)0x0) {
      __ptr = (void *)0x0;
    }
    else {
      puVar4 = (uint32_t *)calloc(__nmemb,4);
      if (puVar4 != (uint32_t *)0x0) {
        iVar2 = 0;
        phf->seed = seed;
        phf->r = __nmemb;
        phf->m = sVar7;
        phf->g = puVar4;
        phf->d_max = 0;
        phf->g_op = PHF_G_UINT32_BAND_R;
        phf->g_jmp = (void *)0x0;
        goto LAB_00132fcf;
      }
    }
  }
  piVar5 = __errno_location();
  iVar2 = *piVar5;
LAB_00132fcf:
  free(__ptr);
  free(local_58);
  free(__base);
  return iVar2;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}